

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cpp
# Opt level: O2

int main(void)

{
  string value;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&local_50);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of std::stoull, string \'");
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:28:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:28:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of std::strtoull, string \'");
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:40:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:40:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of jsteemann::atoi, string \'");
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:52:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:52:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of jsteemann::atoi_positive, string \'");
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:65:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:65:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of jsteemann::atoi_positive_unchecked, string \'")
  ;
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:78:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:78:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::string::assign((char *)&local_50);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of std::stoull, string \'");
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:28:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:28:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of std::strtoull, string \'");
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:40:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:40:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of jsteemann::atoi, string \'");
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:52:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:52:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of jsteemann::atoi_positive, string \'");
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:65:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:65:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of jsteemann::atoi_positive_unchecked, string \'")
  ;
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:78:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:78:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::string::assign((char *)&local_50);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of std::stoull, string \'");
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:28:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:28:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of std::strtoull, string \'");
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:40:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:40:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of jsteemann::atoi, string \'");
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:52:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:52:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of jsteemann::atoi_positive, string \'");
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:65:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:65:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of jsteemann::atoi_positive_unchecked, string \'")
  ;
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:78:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:78:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::string::assign((char *)&local_50);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of std::stoull, string \'");
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:28:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:28:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of std::strtoull, string \'");
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:40:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:40:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of jsteemann::atoi, string \'");
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:52:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:52:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of jsteemann::atoi_positive, string \'");
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:65:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:65:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of jsteemann::atoi_positive_unchecked, string \'")
  ;
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:78:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:78:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::string::assign((char *)&local_50);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of std::stoull, string \'");
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:28:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:28:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of std::strtoull, string \'");
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:40:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:40:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of jsteemann::atoi, string \'");
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:52:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:52:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of jsteemann::atoi_positive, string \'");
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:65:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:65:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_f0,500000000);
  std::operator+(&local_d0,&local_f0," iterations of jsteemann::atoi_positive_unchecked, string \'")
  ;
  std::operator+(&local_b0,&local_d0,&local_50);
  std::operator+(&local_90,&local_b0,"\'");
  local_70._M_unused._M_object = (void *)0x1dcd6500;
  local_58 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:78:16)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:78:16)>
             ::_M_manager;
  local_70._8_8_ = &local_50;
  measure(&local_90,(function<unsigned_long_long_()> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&local_50);
  return 0;
}

Assistant:

int main() {
  std::size_t const n = 500 * 1000 * 1000;
  std::string value;

  // callback functions for the benchmark
   
  // using std::stoull
  auto func1 = [n, &value]() {
    volatile unsigned long long total = 0;
    for (std::size_t i = 0; i < n; ++i) {
      std::size_t nc;
      auto result = std::stoull(value, &nc);
      // in here so compiler does not optimize it away
      total += result;
    }
    return total;
  };
  
  // using std::strtoull 
  auto func2 = [n, &value]() {
    volatile unsigned long long total = 0;
    for (std::size_t i = 0; i < n; ++i) {
      char* endptr;
      auto result = std::strtoull(value.c_str(), &endptr, 10);
      // in here so compiler does not optimize it away
      total += result;
    }
    return total;
  };
  
  // using jsteemann::atoi
  auto func3 = [n, &value]() {
    volatile unsigned long long total = 0;
    for (std::size_t i = 0; i < n; ++i) {
      bool valid;
      auto result = jsteemann::atoi<unsigned long long>(value.data(), value.data() + value.size(), valid);
      // in here so compiler does not optimize it away
      total += result;
    }
    return total;
  };
  
  
  // using jsteemann::atoi_positive
  auto func4 = [n, &value]() {
    volatile unsigned long long total = 0;
    for (std::size_t i = 0; i < n; ++i) {
      bool valid;
      auto result = jsteemann::atoi_positive<unsigned long long>(value.data(), value.data() + value.size(), valid);
      // in here so compiler does not optimize it away
      total += result;
    }
    return total;
  };
  
  
  // using jsteemann::atoi_positive_unchecked
  auto func5 = [n, &value]() {
    volatile unsigned long long total = 0;
    for (std::size_t i = 0; i < n; ++i) {
      auto result = jsteemann::atoi_positive_unchecked<unsigned long long>(value.data(), value.data() + value.size());
      // in here so compiler does not optimize it away
      total += result;
    }
    return total;
  };
  
  
  // use a very short value for starting 
  value = "7";
  (void) measure(std::to_string(n) + " iterations of std::stoull, string '" + value + "'", func1);
  (void) measure(std::to_string(n) + " iterations of std::strtoull, string '" + value + "'", func2);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi, string '" + value + "'", func3);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive, string '" + value + "'", func4);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive_unchecked, string '" + value + "'", func5);
  std::cout << std::endl;
  
  
  // three bytes now
  value = "874";
  (void) measure(std::to_string(n) + " iterations of std::stoull, string '" + value + "'", func1);
  (void) measure(std::to_string(n) + " iterations of std::strtoull, string '" + value + "'", func2);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi, string '" + value + "'", func3);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive, string '" + value + "'", func4);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive_unchecked, string '" + value + "'", func5);
  std::cout << std::endl;
    

  // try a slightly longer value now
  value = "123456";
  (void) measure(std::to_string(n) + " iterations of std::stoull, string '" + value + "'", func1);
  (void) measure(std::to_string(n) + " iterations of std::strtoull, string '" + value + "'", func2);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi, string '" + value + "'", func3);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive, string '" + value + "'", func4);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive_unchecked, string '" + value + "'", func5);
  std::cout << std::endl;
  
  
  // it only gets longer
  value = "12345654666646";
  (void) measure(std::to_string(n) + " iterations of std::stoull, string '" + value + "'", func1);
  (void) measure(std::to_string(n) + " iterations of std::strtoull, string '" + value + "'", func2);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi, string '" + value + "'", func3);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive, string '" + value + "'", func4);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive_unchecked, string '" + value + "'", func5);
  std::cout << std::endl;
  
  
  // try a rather long value now
  value = "16323949897939569634";
  (void) measure(std::to_string(n) + " iterations of std::stoull, string '" + value + "'", func1);
  (void) measure(std::to_string(n) + " iterations of std::strtoull, string '" + value + "'", func2);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi, string '" + value + "'", func3);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive, string '" + value + "'", func4);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive_unchecked, string '" + value + "'", func5);
  std::cout << std::endl;
}